

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

ssize_t tnt_object_add_int(tnt_stream *s,int64_t value)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  ssize_t sVar4;
  size_t sVar5;
  uint uVar6;
  char local_12;
  undefined1 auStack_11 [7];
  char data [10];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  if (value < 0) {
    if (-0x21 < value) {
      value = (int64_t)(byte)((byte)value | 0xe0);
      goto LAB_0010b54c;
    }
    if (value < -0x80) {
      if (value < -0x8000) {
        if (value < -0x80000000) {
          local_12 = -0x2d;
          goto LAB_0010b5c9;
        }
        local_12 = -0x2e;
        goto LAB_0010b5b3;
      }
      local_12 = -0x2f;
      goto LAB_0010b588;
    }
    local_12 = -0x30;
  }
  else {
    if ((ulong)value < 0x80) {
LAB_0010b54c:
      local_12 = (char)value;
      sVar5 = 1;
      goto LAB_0010b5d5;
    }
    if (0xff < (ulong)value) {
      if (0xffff < (ulong)value) {
        if ((ulong)value >> 0x20 != 0) {
          local_12 = -0x31;
LAB_0010b5c9:
          _auStack_11 = (ulong)value >> 0x38 | (value & 0xff000000000000U) >> 0x28 |
                        (value & 0xff0000000000U) >> 0x18 | (value & 0xff00000000U) >> 8 |
                        (value & 0xff000000U) << 8 | (value & 0xff0000U) << 0x18 |
                        (value & 0xff00U) << 0x28 | value << 0x38;
          sVar5 = 9;
          goto LAB_0010b5d5;
        }
        local_12 = -0x32;
LAB_0010b5b3:
        uVar6 = (uint)value;
        _auStack_11 = CONCAT44(stack0xfffffffffffffff3,
                               uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                               uVar6 << 0x18);
        sVar5 = 5;
        goto LAB_0010b5d5;
      }
      local_12 = -0x33;
LAB_0010b588:
      _auStack_11 = CONCAT62(stack0xfffffffffffffff1,(ushort)value << 8 | (ushort)value >> 8);
      sVar5 = 3;
      goto LAB_0010b5d5;
    }
    local_12 = -0x34;
  }
  _auStack_11 = CONCAT71(stack0xfffffffffffffff0,(byte)value);
  sVar5 = 2;
LAB_0010b5d5:
  sVar4 = (*s->write)(s,&local_12,sVar5);
  return sVar4;
}

Assistant:

ssize_t
tnt_object_add_int (struct tnt_stream *s, int64_t value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[10], *end;
	if (value < 0)
		end = mp_encode_int(data, value);
	else
		end = mp_encode_uint(data, value);
	return s->write(s, data, end - data);
}